

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O2

void __thiscall PyreNet::LayerThreadPool::LayerThreadPool(LayerThreadPool *this)

{
  int iVar1;
  bool bVar2;
  
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->jobDoneCv);
  std::condition_variable::condition_variable(&this->newJobCv);
  (this->queueMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queueMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->queueMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queueMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->trackMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->queueMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->trackMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->trackMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->trackMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->trackMutex).super___mutex_base._M_mutex + 8) = 0;
  std::
  queue<PyreNet::LayerThreadPool::LayerQueueJob,std::deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>>
  ::
  queue<std::deque<PyreNet::LayerThreadPool::LayerQueueJob,std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>>,void>
            (&this->layerQueue);
  iVar1 = 0x10;
  instance = this;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
              ((vector<std::thread,std::allocator<std::thread>> *)this,threadJob);
  }
  return;
}

Assistant:

PyreNet::LayerThreadPool::LayerThreadPool() {
        instance = this;
        for (int i = 0; i < 16; ++i) {
            pool.emplace_back(threadJob);
        }
    }